

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# init.c
# Opt level: O1

parser * init_parse_feat(void)

{
  parser *p;
  
  p = parser_new();
  parser_setpriv(p,(void *)0x0);
  parser_reg(p,"code str code",parse_feat_code);
  parser_reg(p,"name str name",parse_feat_name);
  parser_reg(p,"graphics char glyph sym color",parse_feat_graphics);
  parser_reg(p,"mimic str feat",parse_feat_mimic);
  parser_reg(p,"priority uint priority",parse_feat_priority);
  parser_reg(p,"flags ?str flags",parse_feat_flags);
  parser_reg(p,"digging int dig",parse_feat_digging);
  parser_reg(p,"desc str text",parse_feat_desc);
  parser_reg(p,"walk-msg str text",parse_feat_walk_msg);
  parser_reg(p,"run-msg str text",parse_feat_run_msg);
  parser_reg(p,"hurt-msg str text",parse_feat_hurt_msg);
  parser_reg(p,"die-msg str text",parse_feat_die_msg);
  parser_reg(p,"confused-msg str text",parse_feat_confused_msg);
  parser_reg(p,"look-prefix str text",parse_feat_look_prefix);
  parser_reg(p,"look-in-preposition str text",parse_feat_look_in_preposition);
  parser_reg(p,"resist-flag sym flag",parse_feat_resist_flag);
  f_info = (feature *)mem_zalloc(0xaf0);
  return p;
}

Assistant:

static struct parser *init_parse_feat(void) {
	struct parser *p = parser_new();

	parser_setpriv(p, NULL);
	parser_reg(p, "code str code", parse_feat_code);
	parser_reg(p, "name str name", parse_feat_name);
	parser_reg(p, "graphics char glyph sym color", parse_feat_graphics);
	parser_reg(p, "mimic str feat", parse_feat_mimic);
	parser_reg(p, "priority uint priority", parse_feat_priority);
	parser_reg(p, "flags ?str flags", parse_feat_flags);
	parser_reg(p, "digging int dig", parse_feat_digging);
	parser_reg(p, "desc str text", parse_feat_desc);
	parser_reg(p, "walk-msg str text", parse_feat_walk_msg);
	parser_reg(p, "run-msg str text", parse_feat_run_msg);
	parser_reg(p, "hurt-msg str text", parse_feat_hurt_msg);
	parser_reg(p, "die-msg str text", parse_feat_die_msg);
	parser_reg(p, "confused-msg str text", parse_feat_confused_msg);
	parser_reg(p, "look-prefix str text", parse_feat_look_prefix);
	parser_reg(p, "look-in-preposition str text", parse_feat_look_in_preposition);
	parser_reg(p, "resist-flag sym flag", parse_feat_resist_flag);

	/*
	 * Since the layout of the terrain array is fixed by list-terrain.h,
	 * allocate it now and fill in the customizable parts when parsing.
	 */
	f_info = mem_zalloc(FEAT_MAX * sizeof(*f_info));

	return p;
}